

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall
ON_PolyCurve::Split(ON_PolyCurve *this,double split_parameter,ON_Curve **left_side,
                   ON_Curve **right_side)

{
  ON_PolyCurve *pOVar1;
  ON_Curve **__s;
  ON_Curve **ppOVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  ON_PolyCurve *this_00;
  ON_Curve *pOVar6;
  long lVar7;
  ON_PolyCurve *this_01;
  size_t sVar8;
  ON_PolyCurve *this_ptr;
  long lVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  int si;
  ON_Interval c_dom;
  ON_SimpleArray<ON_Curve_*> right_segment;
  ON_SimpleArray<ON_Curve_*> left_segment;
  ON_SimpleArray<double> left_t;
  ON_SimpleArray<double> right_t;
  ON_Curve *seg_right;
  ON_Curve *seg_left;
  ON_Interval s_dom;
  ON_Interval dom;
  uint local_fc;
  ON_Curve **local_f8;
  ON_Curve *local_f0;
  double local_e8;
  ON_PolyCurve *local_e0;
  ON_Interval local_d8;
  ON_SimpleArray<ON_Curve_*> local_c8;
  ON_SimpleArray<ON_Curve_*> local_b0;
  ON_SimpleArray<double> local_98;
  ON_SimpleArray<double> local_80;
  ON_Curve **local_68;
  ON_Curve *local_60;
  ON_Curve *local_58;
  ON_Interval local_50;
  ON_Interval local_40;
  
  local_e8 = split_parameter;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pOVar1 = (ON_PolyCurve *)*left_side;
  if (pOVar1 == (ON_PolyCurve *)0x0) {
    this_00 = (ON_PolyCurve *)0x0;
  }
  else {
    bVar3 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_PolyCurve_class_rtti);
    this_00 = (ON_PolyCurve *)0x0;
    if (bVar3) {
      this_00 = pOVar1;
    }
  }
  pOVar1 = (ON_PolyCurve *)*right_side;
  if (pOVar1 == (ON_PolyCurve *)0x0) {
    this_01 = (ON_PolyCurve *)0x0;
  }
  else {
    bVar3 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_PolyCurve_class_rtti);
    this_01 = (ON_PolyCurve *)0x0;
    if (bVar3) {
      this_01 = pOVar1;
    }
  }
  if (this_00 == this || this_00 == (ON_PolyCurve *)0x0) {
    if (this_00 == this) {
      ON_Curve::DestroyCurveTree(&this_00->super_ON_Curve);
    }
  }
  else {
    ON_CurveArray::Destroy(&this_00->m_segment);
    ON_SimpleArray<double>::SetCapacity(&this_00->m_t,0);
  }
  if (this_01 == this || this_01 == (ON_PolyCurve *)0x0) {
    if (this_01 == this) {
      ON_Curve::DestroyCurveTree(&this_01->super_ON_Curve);
    }
  }
  else {
    ON_CurveArray::Destroy(&this_01->m_segment);
    ON_SimpleArray<double>::SetCapacity(&this_01->m_t,0);
  }
  if ((this_00 == (ON_PolyCurve *)0x0) && (*left_side != (ON_Curve *)0x0)) {
    return false;
  }
  if ((this_01 == (ON_PolyCurve *)0x0) && (*right_side != (ON_Curve *)0x0)) {
    return false;
  }
  bVar3 = ON_Interval::Includes(&local_40,local_e8,true);
  if (!bVar3) {
    return false;
  }
  bVar10 = this_01 == this;
  bVar11 = this_00 == this;
  local_e0 = this_01;
  local_68 = left_side;
  bVar3 = ON_Curve::ParameterSearch
                    (&this->super_ON_Curve,local_e8,(int *)&local_fc,true,&this->m_t,
                     1.490116119385e-08);
  if (bVar3) {
    if ((int)local_fc < 1) {
      return false;
    }
    if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)local_fc) {
      return false;
    }
  }
  local_50 = SegmentDomain(this,local_fc);
  local_d8.m_t[1] = local_50.m_t[1];
  pOVar6 = (ON_Curve *)0x0;
  if ((-1 < (long)(int)local_fc) &&
     ((int)local_fc < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
    pOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)local_fc];
  }
  if (pOVar6 == (ON_Curve *)0x0) {
    return false;
  }
  (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar6);
  if (bVar3) {
    pdVar5 = ON_Interval::operator[](&local_d8,0);
    local_f8 = (ON_Curve **)*pdVar5;
  }
  else {
    local_f8 = (ON_Curve **)ON_Interval::TransformParameterTo(&local_50,&local_d8,local_e8);
  }
  local_58 = (ON_Curve *)0x0;
  local_60 = (ON_Curve *)0x0;
  if ((bVar3) || (bVar3 = ON_Interval::Includes(&local_d8,(double)local_f8,true), !bVar3)) {
    dVar12 = ON_Interval::ParameterAt(&local_d8,0.5);
    pdVar5 = ON_Interval::operator[](&local_d8,(uint)(dVar12 < (double)local_f8));
    local_f8 = (ON_Curve **)*pdVar5;
  }
  else {
    iVar4 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                      (local_f8,pOVar6,&local_58,&local_60);
    if ((char)iVar4 == '\0') {
      dVar12 = ON_Interval::NormalizedParameterAt(&local_d8,(double)local_f8);
      iVar4 = 0;
      if (dVar12 <= 0.001) {
LAB_00596189:
        pdVar5 = ON_Interval::operator[](&local_d8,iVar4);
        local_f8 = (ON_Curve **)*pdVar5;
        bVar3 = true;
      }
      else {
        dVar12 = ON_Interval::NormalizedParameterAt(&local_d8,(double)local_f8);
        iVar4 = 1;
        if (0.999 <= dVar12) goto LAB_00596189;
        bVar3 = false;
      }
      if (!bVar3) {
        return false;
      }
    }
  }
  local_b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ad30;
  local_b0.m_a = (ON_Curve **)0x0;
  local_b0.m_count = 0;
  local_b0.m_capacity = 0;
  local_c8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ad30;
  local_c8.m_a = (ON_Curve **)0x0;
  local_c8.m_count = 0;
  local_c8.m_capacity = 0;
  local_98._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
  local_98.m_a = (double *)0x0;
  local_98.m_count = 0;
  local_98.m_capacity = 0;
  local_80._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
  local_80.m_a = (double *)0x0;
  local_80.m_count = 0;
  local_80.m_capacity = 0;
  if ((local_58 == (ON_Curve *)0x0) || (local_60 == (ON_Curve *)0x0)) {
    pdVar5 = ON_Interval::operator[](&local_d8,1);
    if (((double)local_f8 == *pdVar5) && (!NAN((double)local_f8) && !NAN(*pdVar5))) {
      local_fc = local_fc + 1;
    }
    pdVar5 = ON_Interval::operator[](&local_d8,0);
    if ((((double)local_f8 != *pdVar5) || (NAN((double)local_f8) || NAN(*pdVar5))) ||
       (local_fc != 0)) {
      pdVar5 = ON_Interval::operator[](&local_d8,1);
      if ((((double)local_f8 != *pdVar5) || (NAN((double)local_f8) || NAN(*pdVar5))) ||
         (local_fc != (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
        if ((uint)local_b0.m_capacity < local_fc) {
          ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_b0,(long)(int)local_fc);
        }
        sVar8 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count -
                (long)(int)local_fc;
        if ((uint)local_c8.m_capacity < (uint)sVar8) {
          ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_c8,sVar8);
        }
        if ((uint)local_98.m_capacity < (uint)((long)local_b0.m_count + 1U)) {
          ON_SimpleArray<double>::SetCapacity(&local_98,(long)local_b0.m_count + 1U);
        }
        if ((uint)local_80.m_capacity < (uint)((long)local_c8.m_count + 1U)) {
          ON_SimpleArray<double>::SetCapacity(&local_80,(long)local_c8.m_count + 1U);
        }
        if (0 < (int)local_fc) {
          lVar9 = 0;
          lVar7 = 0;
          do {
            if (bVar11 || bVar10) {
              ON_SimpleArray<ON_Curve_*>::Append
                        (&local_b0,
                         (ON_Curve **)
                         ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
            }
            else {
              local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                              ((long)(this->m_segment).
                                                     super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
              ON_SimpleArray<ON_Curve_*>::Append(&local_b0,&local_f0);
            }
            ON_SimpleArray<double>::Append(&local_98,(double *)((long)(this->m_t).m_a + lVar9));
            lVar7 = lVar7 + 1;
            lVar9 = lVar9 + 8;
          } while (lVar7 < (int)local_fc);
        }
        ON_SimpleArray<double>::Append(&local_98,&local_e8);
        lVar7 = (long)(int)local_fc;
        iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
        if ((int)local_fc < iVar4) {
          lVar9 = lVar7 * 8;
          do {
            if (bVar11 || bVar10) {
              ON_SimpleArray<ON_Curve_*>::Append
                        (&local_c8,
                         (ON_Curve **)
                         ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
            }
            else {
              local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                              ((long)(this->m_segment).
                                                     super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
              ON_SimpleArray<ON_Curve_*>::Append(&local_c8,&local_f0);
            }
            pdVar5 = (double *)((long)(this->m_t).m_a + lVar9);
            if ((uint)lVar7 == local_fc) {
              pdVar5 = &local_e8;
            }
            ON_SimpleArray<double>::Append(&local_80,pdVar5);
            lVar7 = lVar7 + 1;
            iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
            lVar9 = lVar9 + 8;
          } while (lVar7 < iVar4);
        }
        goto LAB_00596041;
      }
    }
    bVar3 = false;
  }
  else {
    if ((int)((long)(int)local_fc + 1U) != 0) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_b0,(long)(int)local_fc + 1U);
    }
    sVar8 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count - (long)(int)local_fc;
    if ((uint)local_c8.m_capacity < (uint)sVar8) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_c8,sVar8);
    }
    if ((uint)local_98.m_capacity < (uint)((long)local_b0.m_count + 1U)) {
      ON_SimpleArray<double>::SetCapacity(&local_98,(long)local_b0.m_count + 1U);
    }
    if ((uint)local_80.m_capacity < (uint)((long)local_c8.m_count + 1U)) {
      ON_SimpleArray<double>::SetCapacity(&local_80,(long)local_c8.m_count + 1U);
    }
    if (bVar11 || bVar10) {
      pOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)local_fc];
      if (pOVar6 != (ON_Curve *)0x0) {
        (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)local_fc] = (ON_Curve *)0x0;
    }
    if (0 < (int)local_fc) {
      lVar9 = 0;
      lVar7 = 0;
      do {
        if (bVar11 || bVar10) {
          ON_SimpleArray<ON_Curve_*>::Append
                    (&local_b0,
                     (ON_Curve **)
                     ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar9));
        }
        else {
          local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                          ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.
                                                 m_a + lVar9));
          ON_SimpleArray<ON_Curve_*>::Append(&local_b0,&local_f0);
        }
        ON_SimpleArray<double>::Append(&local_98,(double *)((long)(this->m_t).m_a + lVar9));
        lVar7 = lVar7 + 1;
        lVar9 = lVar9 + 8;
      } while (lVar7 < (int)local_fc);
    }
    ON_SimpleArray<ON_Curve_*>::Append(&local_b0,&local_58);
    ON_SimpleArray<double>::Append(&local_98,(this->m_t).m_a + (int)local_fc);
    ON_SimpleArray<double>::Append(&local_98,&local_e8);
    ON_SimpleArray<ON_Curve_*>::Append(&local_c8,&local_60);
    ON_SimpleArray<double>::Append(&local_80,&local_e8);
    lVar9 = (long)(int)local_fc;
    lVar7 = lVar9 * 8;
    local_f8 = right_side;
    while( true ) {
      lVar7 = lVar7 + 8;
      lVar9 = lVar9 + 1;
      iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
      right_side = local_f8;
      if (iVar4 <= lVar9) break;
      if (bVar11 || bVar10) {
        ON_SimpleArray<ON_Curve_*>::Append
                  (&local_c8,
                   (ON_Curve **)
                   ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar7));
      }
      else {
        local_f0 = ON_Curve::Duplicate(*(ON_Curve **)
                                        ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.
                                               m_a + lVar7));
        ON_SimpleArray<ON_Curve_*>::Append(&local_c8,&local_f0);
      }
      ON_SimpleArray<double>::Append(&local_80,(double *)(lVar7 + (long)(this->m_t).m_a));
    }
LAB_00596041:
    ppOVar2 = local_68;
    ON_SimpleArray<double>::Append(&local_80,(this->m_t).m_a + iVar4);
    if (this_00 == (ON_PolyCurve *)0x0) {
      this_00 = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(this_00);
    }
    if (local_e0 == (ON_PolyCurve *)0x0) {
      local_e0 = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(local_e0);
    }
    if (bVar11 || bVar10) {
      __s = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
      if ((__s != (ON_Curve **)0x0) &&
         (lVar7 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity, 0 < lVar7)) {
        memset(__s,0,lVar7 << 3);
      }
      pdVar5 = (this->m_t).m_a;
      if ((pdVar5 != (double *)0x0) && (lVar7 = (long)(this->m_t).m_capacity, 0 < lVar7)) {
        memset(pdVar5,0,lVar7 << 3);
      }
      if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
        (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
      }
      if (-1 < (this->m_t).m_capacity) {
        (this->m_t).m_count = 0;
      }
    }
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this_00->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_b0.m_count,local_b0.m_a)
    ;
    ON_SimpleArray<double>::Append(&this_00->m_t,local_98.m_count,local_98.m_a);
    ON_SimpleArray<ON_Curve_*>::Append
              (&(local_e0->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_c8.m_count,local_c8.m_a
              );
    ON_SimpleArray<double>::Append(&local_e0->m_t,local_80.m_count,local_80.m_a);
    *ppOVar2 = &this_00->super_ON_Curve;
    *right_side = &local_e0->super_ON_Curve;
    bVar3 = true;
  }
  ON_SimpleArray<double>::~ON_SimpleArray(&local_80);
  ON_SimpleArray<double>::~ON_SimpleArray(&local_98);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_c8);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_b0);
  return bVar3;
}

Assistant:

bool ON_PolyCurve::Split(
    double split_parameter,
    ON_Curve*& left_side, // left portion returned here
    ON_Curve*& right_side // right portion returned here
  ) const
{
  int si;
  ON_Interval dom = Domain();
  
  ON_PolyCurve* pLeftSide  = ON_PolyCurve::Cast(left_side);
  ON_PolyCurve* pRightSide = ON_PolyCurve::Cast(right_side);

  if ( pLeftSide && pLeftSide != this )
    pLeftSide->Destroy();
  else if ( pLeftSide == this )
    pLeftSide->DestroyCurveTree();

  if ( pRightSide && pRightSide != this )
    pRightSide->Destroy();
  else if ( pRightSide == this )
    pRightSide->DestroyCurveTree();

  if ( left_side && !pLeftSide )
    return false;
  if ( right_side && !pRightSide )
    return false;
  if ( !dom.Includes( split_parameter, true ) )
    return false; // split_parameter is not an interior parameter


  const bool bDupSegs = ( this != pLeftSide && this != pRightSide );

		/* 4 April 2003 Greg Arden		Made the following changes:
																		1.	Use ParameterSearch() to decide if we should snap domain
																				boundaries to m_t array values.
																		2.  Make sure resulting polycurves have Domain() specified as 
																				split parameter.   
																		3.  When true is returned the result passes IsValid().
		*/
	bool split_at_break = ParameterSearch(split_parameter, si, true);
	if( split_at_break && (si<=0 || si>=Count() ) )
		return false;

	ON_Interval s_dom = SegmentDomain(si);
  ON_Curve* seg_curve = SegmentCurve(si);
  if ( !seg_curve )
    return false;
  ON_Interval c_dom = seg_curve->Domain();

  double c;
  if (split_at_break)
    c = c_dom[0];
  else
    c = s_dom.TransformParameterTo(c_dom, split_parameter);

  ON_Curve* seg_left = 0;
  ON_Curve* seg_right = 0;

  if ( !split_at_break  && c_dom.Includes(c,true) )
  {
    if ( !seg_curve->Split( c, seg_left, seg_right ) )
    {
      double fuzz = 0.001; // anything small and > 1.0e-6 will work about the same.
      if ( c_dom.NormalizedParameterAt(c) <= fuzz )
        c = c_dom[0];
      else if ( c_dom.NormalizedParameterAt(c) >= 1.0 - fuzz )
        c = c_dom[1];
      else
        return false; // unable to split this segment
    }
  }
  else if ( c <= c_dom.ParameterAt(0.5) )
    c = c_dom[0];
  else
    c = c_dom[1];

  // use scratch arrays since this may also be pLeftSide or pRightSide
  ON_SimpleArray< ON_Curve* > left_segment;
  ON_SimpleArray< ON_Curve* > right_segment;
  ON_SimpleArray< double > left_t;
  ON_SimpleArray< double > right_t;

  int i;

  if ( seg_left && seg_right )
  {
    // we split a segment
    left_segment.Reserve(si+1);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    if ( !bDupSegs )
    {
      delete m_segment[si];
      const_cast<ON_PolyCurve*>(this)->m_segment[si] = 0;
    }
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_segment.Append( seg_left );
    left_t.Append( m_t[si] );
    left_t.Append( split_parameter );

    right_segment.Append(seg_right);
    right_t.Append( split_parameter );
    for ( i = si+1; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }
  else 
  {
    if ( c == c_dom[1] )
      si++;
		if( (c==c_dom[0] && si==0 ) ||								// attempting split at curve start
				(c==c_dom[1] && si==m_segment.Count() ) )	// attempting split at curve end
			return false;

    left_segment.Reserve(si);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_t.Append( split_parameter );

    for ( i = si; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      if ( i == si )
        right_t.Append( split_parameter );
      else
        right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }

  if ( !pLeftSide )
    pLeftSide = new ON_PolyCurve();
  if ( !pRightSide )
    pRightSide = new ON_PolyCurve();
  if ( !bDupSegs )
  {
    // pLeftSide or pRightSide is the same as this
    ON_PolyCurve* this_ptr = const_cast<ON_PolyCurve*>(this);
    this_ptr->m_segment.Zero();
    this_ptr->m_t.Zero();
    this_ptr->m_segment.SetCount(0);
    this_ptr->m_t.SetCount(0);
  }

  pLeftSide->m_segment.Append( left_segment.Count(), left_segment.Array() );
  pLeftSide->m_t.Append( left_t.Count(), left_t.Array() );
  pRightSide->m_segment.Append( right_segment.Count(), right_segment.Array() );
  pRightSide->m_t.Append( right_t.Count(), right_t.Array() );

  left_side = pLeftSide;
  right_side = pRightSide;

  return true;
}